

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O0

bool_t strStartsWith(char *str,char *prefix)

{
  char *prefix_local;
  char *str_local;
  
  prefix_local = prefix;
  str_local = str;
  while( true ) {
    if (*prefix_local == '\0') {
      return 1;
    }
    if (*str_local != *prefix_local) break;
    prefix_local = prefix_local + 1;
    str_local = str_local + 1;
  }
  return 0;
}

Assistant:

bool_t strStartsWith(const char* str, const char* prefix)
{
	ASSERT(strIsValid(str));
	ASSERT(strIsValid(prefix));
	for(; *prefix; ++prefix, ++str)
		if (*str != *prefix)
			return FALSE;
	return TRUE;
}